

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::PopulateLinkDirectoriesInterface
          (cmExportFileGenerator *this,cmGeneratorTarget *gt,PreprocessContext preprocessRule,
          ImportPropertyMap *properties)

{
  bool bVar1;
  cmValue input;
  mapped_type *pmVar2;
  allocator<char> local_71;
  string prepro;
  string local_50;
  
  if (preprocessRule == InstallInterface) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prepro,"INTERFACE_LINK_DIRECTORIES",(allocator<char> *)&local_50);
    input = cmGeneratorTarget::GetProperty(gt,&prepro);
    std::__cxx11::string::~string((string *)&prepro);
    if (input.Value != (string *)0x0) {
      if ((input.Value)->_M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&prepro,"INTERFACE_LINK_DIRECTORIES",(allocator<char> *)&local_50);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&prepro);
        pmVar2->_M_string_length = 0;
        *(pmVar2->_M_dataplus)._M_p = '\0';
      }
      else {
        cmGeneratorExpression::Preprocess(&prepro,input.Value,InstallInterface,true);
        if (prepro._M_string_length != 0) {
          ResolveTargetsInGeneratorExpressions(this,&prepro,gt,NoReplaceFreeTargets);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"INTERFACE_LINK_DIRECTORIES",&local_71);
          bVar1 = checkInterfaceDirs(&prepro,gt,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,"INTERFACE_LINK_DIRECTORIES",&local_71);
            pmVar2 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](properties,&local_50);
            std::__cxx11::string::_M_assign((string *)pmVar2);
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
      }
      std::__cxx11::string::~string((string *)&prepro);
    }
    return;
  }
  __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmExportFileGenerator.cxx"
                ,0x1d3,
                "void cmExportFileGenerator::PopulateLinkDirectoriesInterface(const cmGeneratorTarget *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &)"
               );
}

Assistant:

void cmExportFileGenerator::PopulateLinkDirectoriesInterface(
  cmGeneratorTarget const* gt,
  cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties)
{
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  const char* propName = "INTERFACE_LINK_DIRECTORIES";
  cmValue input = gt->GetProperty(propName);

  if (!input) {
    return;
  }

  if (input->empty()) {
    properties[propName].clear();
    return;
  }

  std::string prepro =
    cmGeneratorExpression::Preprocess(*input, preprocessRule, true);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, gt);

    if (!checkInterfaceDirs(prepro, gt, propName)) {
      return;
    }
    properties[propName] = prepro;
  }
}